

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O3

ze_result_t validation_layer::zeContextDestroy(ze_context_handle_t hContext)

{
  code *pcVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  ze_result_t result;
  ze_result_t zVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar4 = context;
  lVar8 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"zeContextDestroy(hContext)","");
  if (*(char *)(lVar8 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar8 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar1 = *(code **)(lVar4 + 0x1a8);
  if (pcVar1 == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar8 = *(long *)(lVar4 + 0xd30);
    lVar2 = *(long *)(lVar4 + 0xd38);
    lVar7 = lVar2 - lVar8 >> 3;
    if (lVar2 != lVar8) {
      lVar6 = 0;
      do {
        plVar3 = (long *)**(undefined8 **)(*(long *)(lVar4 + 0xd30) + lVar6 * 8);
        result = (**(code **)(*plVar3 + 0x1b0))(plVar3,hContext);
        if (result != ZE_RESULT_SUCCESS) goto LAB_0014d0d7;
        lVar6 = lVar6 + 1;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar6);
    }
    if (((*(char *)(lVar4 + 4) != '\x01') ||
        (result = ZEHandleLifetimeValidation::zeContextDestroyPrologue
                            (*(ZEHandleLifetimeValidation **)(lVar4 + 0xd48),hContext),
        result == ZE_RESULT_SUCCESS)) &&
       (zVar5 = (*pcVar1)(hContext), result = zVar5, lVar2 != lVar8)) {
      lVar8 = 0;
      do {
        plVar3 = (long *)**(undefined8 **)(*(long *)(lVar4 + 0xd30) + lVar8 * 8);
        result = (**(code **)(*plVar3 + 0x1b8))(plVar3,hContext,zVar5);
        if (result != ZE_RESULT_SUCCESS) break;
        lVar8 = lVar8 + 1;
        result = zVar5;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar8);
    }
  }
LAB_0014d0d7:
  logAndPropagateResult("zeContextDestroy",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeContextDestroy(
        ze_context_handle_t hContext                    ///< [in][release] handle of context object to destroy
        )
    {
        context.logger->log_trace("zeContextDestroy(hContext)");

        auto pfnDestroy = context.zeDdiTable.Context.pfnDestroy;

        if( nullptr == pfnDestroy )
            return logAndPropagateResult("zeContextDestroy", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeContextDestroyPrologue( hContext );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeContextDestroy", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeContextDestroyPrologue( hContext );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeContextDestroy", result);
        }

        auto driver_result = pfnDestroy( hContext );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeContextDestroyEpilogue( hContext ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeContextDestroy", result);
        }

        return logAndPropagateResult("zeContextDestroy", driver_result);
    }